

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O3

void sat_solver_random_polarity(sat_solver *s)

{
  word wVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  if (0 < s->size) {
    iVar4 = 0;
    lVar5 = 0;
    do {
      wVar1 = Gia_ManRandomW(0);
      uVar2 = 0;
      do {
        lVar3 = (long)s->size;
        if (lVar3 <= (long)((long)iVar4 + uVar2)) goto LAB_00550f0a;
        s->polarity[uVar2 + (long)iVar4] = (wVar1 >> (uVar2 & 0x3f) & 1) != 0;
        uVar2 = uVar2 + 1;
      } while (uVar2 != 0x40);
      lVar3 = (long)s->size;
LAB_00550f0a:
      lVar5 = lVar5 + 0x40;
      iVar4 = iVar4 + 0x1000;
    } while (lVar5 < lVar3);
  }
  return;
}

Assistant:

static void sat_solver_random_polarity(sat_solver* s)
{
    int i, k;
    for ( i = 0; i < s->size; i += 64 )
    {
        word Polar = Gia_ManRandomW(0);
        for ( k = 0; k < 64 && (i << 6) + k < s->size; k++ )
            s->polarity[(i << 6) + k] = Abc_TtGetBit(&Polar, k);
    }
}